

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_return.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::dispatch::detail::Handle_Return<chaiscript::Type_Info>::
handle<chaiscript::Type_Info,void>(Handle_Return<chaiscript::Type_Info> *this,Type_Info *r)

{
  type_info *ptVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar3;
  Boxed_Value BVar4;
  shared_ptr<chaiscript::Type_Info> local_28;
  
  local_28.super___shared_ptr<chaiscript::Type_Info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_28.super___shared_ptr<chaiscript::Type_Info,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  (local_28.super___shared_ptr<chaiscript::Type_Info,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_use_count = 1;
  (local_28.super___shared_ptr<chaiscript::Type_Info,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_weak_count = 1;
  (local_28.super___shared_ptr<chaiscript::Type_Info,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_003b60d8;
  local_28.super___shared_ptr<chaiscript::Type_Info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_28.super___shared_ptr<chaiscript::Type_Info,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  ptVar1 = r->m_bare_type_info;
  local_28.super___shared_ptr<chaiscript::Type_Info,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._vptr__Sp_counted_base = (_func_int **)r->m_type_info;
  *(type_info **)
   &local_28.super___shared_ptr<chaiscript::Type_Info,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    [1]._M_use_count = ptVar1;
  local_28.super___shared_ptr<chaiscript::Type_Info,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [2]._vptr__Sp_counted_base = *(_func_int ***)&r->m_flags;
  sVar3 = Boxed_Value::Object_Data::get<chaiscript::Type_Info>((Object_Data *)this,&local_28,true);
  _Var2 = sVar3.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if (local_28.super___shared_ptr<chaiscript::Type_Info,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<chaiscript::Type_Info,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var2._M_pi = extraout_RDX;
  }
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value handle(T &&r) {
          return Boxed_Value(std::make_shared<T>(std::forward<T>(r)), true);
        }